

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

cmValue cmTargetPropertyComputer::GetSources<cmTarget>(cmTarget *tgt,cmMakefile *mf)

{
  bool bVar1;
  MessageType t;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  this;
  bool bVar2;
  PolicyStatus PVar3;
  int iVar4;
  reference input;
  char *pcVar5;
  ostream *poVar6;
  size_type sVar7;
  cmMakefile *this_00;
  cmSourceFile *this_01;
  string *psVar8;
  ulong uVar9;
  PolicyID id;
  string_view sVar10;
  string local_470 [32];
  string local_450 [8];
  string sname;
  cmSourceFileLocation *location;
  cmSourceFile *sf;
  string local_400;
  MessageType local_3dc;
  undefined1 local_3d8 [4];
  MessageType messageType;
  ostringstream e;
  undefined1 local_258 [2];
  bool noMessage;
  bool addContent;
  string objLibName;
  string *file;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_1f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end1;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1c0;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin1;
  cmBTStringRange *__range1;
  char *sep;
  ostringstream ss;
  undefined1 local_30 [8];
  cmBTStringRange entries;
  cmMakefile *mf_local;
  cmTarget *tgt_local;
  
  entries.End._M_current =
       (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)mf;
  _local_30 = cmTarget::GetSourceEntries_abi_cxx11_(tgt);
  bVar2 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::empty((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)local_30);
  if (bVar2) {
    cmValue::cmValue((cmValue *)&tgt_local,(nullptr_t)0x0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&sep);
    __range1 = (cmBTStringRange *)0xcbf1b7;
    __begin1._M_current =
         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         local_30;
    local_1c0 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                         *)__begin1._M_current);
    entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
            cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::end(__begin1._M_current);
    while (bVar2 = __gnu_cxx::operator!=
                             (&local_1c0,
                              (__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                               *)&entry), bVar2) {
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &__gnu_cxx::
            __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&local_1c0)->Value;
      sVar10 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view
                         ((string *)
                          files.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1f8,sVar10,false);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1f8);
      file = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1f8);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&file), bVar2) {
        input = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end2);
        sVar10 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)input);
        objLibName.field_2._8_8_ = sVar10._M_len;
        bVar2 = cmHasLiteralPrefix<18ul>(sVar10,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((bVar2) && (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 == '>')) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_258,(ulong)input);
          sVar7 = cmGeneratorExpression::Find((string *)local_258);
          if (sVar7 == 0xffffffffffffffff) {
            bVar1 = false;
            bVar2 = true;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
            local_3dc = AUTHOR_WARNING;
            PVar3 = cmMakefile::GetPolicyStatus((cmMakefile *)entries.End._M_current,CMP0051,false);
            if (PVar3 != OLD) {
              if (PVar3 == WARN) {
                cmPolicies::GetPolicyWarning_abi_cxx11_(&local_400,(cmPolicies *)0x33,id);
                poVar6 = std::operator<<((ostream *)local_3d8,(string *)&local_400);
                std::operator<<(poVar6,"\n");
                std::__cxx11::string::~string((string *)&local_400);
                bVar2 = false;
              }
              else if (PVar3 - NEW < 3) {
                bVar1 = true;
              }
            }
            if (!bVar2) {
              poVar6 = std::operator<<((ostream *)local_3d8,"Target \"");
              psVar8 = cmTarget::GetName_abi_cxx11_(tgt);
              poVar6 = std::operator<<(poVar6,(string *)psVar8);
              std::operator<<(poVar6,
                              "\" contains $<TARGET_OBJECTS> generator expression in its sources list.  This content was not previously part of the SOURCES property when that property was read at configure time.  Code reading that property needs to be adapted to ignore the generator expression using the string(GENEX_STRIP) command."
                             );
              this = entries.End;
              t = local_3dc;
              std::__cxx11::ostringstream::str();
              cmMakefile::IssueMessage((cmMakefile *)this._M_current,t,(string *)&sf);
              std::__cxx11::string::~string((string *)&sf);
            }
            if (bVar1) {
              std::operator<<((ostream *)&sep,(char *)__range1);
              __range1 = (cmBTStringRange *)0xc618fd;
              std::operator<<((ostream *)&sep,(string *)input);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
          }
          else {
            std::operator<<((ostream *)&sep,(char *)__range1);
            __range1 = (cmBTStringRange *)0xc618fd;
            std::operator<<((ostream *)&sep,(string *)input);
          }
          std::__cxx11::string::~string((string *)local_258);
        }
        else {
          sVar7 = cmGeneratorExpression::Find(input);
          if (sVar7 == 0xffffffffffffffff) {
            std::operator<<((ostream *)&sep,(char *)__range1);
            std::operator<<((ostream *)&sep,(string *)input);
          }
          else {
            this_00 = cmTarget::GetMakefile(tgt);
            this_01 = cmMakefile::GetOrCreateSource(this_00,input,false,Ambiguous);
            sname.field_2._8_8_ = cmSourceFile::GetLocation(this_01);
            psVar8 = cmSourceFileLocation::GetDirectory_abi_cxx11_
                               ((cmSourceFileLocation *)sname.field_2._8_8_);
            std::__cxx11::string::string(local_450,(string *)psVar8);
            uVar9 = std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              std::__cxx11::string::operator+=(local_450,"/");
            }
            psVar8 = cmSourceFileLocation::GetName_abi_cxx11_
                               ((cmSourceFileLocation *)sname.field_2._8_8_);
            std::__cxx11::string::operator+=(local_450,(string *)psVar8);
            std::operator<<((ostream *)&sep,(char *)__range1);
            std::operator<<((ostream *)&sep,local_450);
            std::__cxx11::string::~string(local_450);
          }
          __range1 = (cmBTStringRange *)0xc618fd;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1f8);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&local_1c0);
    }
    if ((GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_ == '\0') &&
       (iVar4 = __cxa_guard_acquire(&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::
                                     srcs_abi_cxx11_), iVar4 != 0)) {
      std::__cxx11::string::string
                ((string *)&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_
                );
      __cxa_atexit(std::__cxx11::string::~string,
                   &GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_)
      ;
    }
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=
              ((string *)&GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_,
               local_470);
    std::__cxx11::string::~string(local_470);
    cmValue::cmValue((cmValue *)&tgt_local,
                     &GetSources<cmTarget>(cmTarget_const*,cmMakefile_const&)::srcs_abi_cxx11_);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&sep);
  }
  return (cmValue)(string *)tgt_local;
}

Assistant:

cmValue cmTargetPropertyComputer::GetSources<cmTarget>(cmTarget const* tgt,
                                                       cmMakefile const& mf)
{
  cmBTStringRange entries = tgt->GetSourceEntries();
  if (entries.empty()) {
    return nullptr;
  }

  std::ostringstream ss;
  const char* sep = "";
  for (auto const& entry : entries) {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    for (std::string const& file : files) {
      if (cmHasLiteralPrefix(file, "$<TARGET_OBJECTS:") &&
          file.back() == '>') {
        std::string objLibName = file.substr(17, file.size() - 18);

        if (cmGeneratorExpression::Find(objLibName) != std::string::npos) {
          ss << sep;
          sep = ";";
          ss << file;
          continue;
        }

        bool addContent = false;
        bool noMessage = true;
        std::ostringstream e;
        MessageType messageType = MessageType::AUTHOR_WARNING;
        switch (mf.GetPolicyStatus(cmPolicies::CMP0051)) {
          case cmPolicies::WARN:
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0051) << "\n";
            noMessage = false;
            CM_FALLTHROUGH;
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::NEW:
            addContent = true;
            break;
        }
        if (!noMessage) {
          e << "Target \"" << tgt->GetName()
            << "\" contains $<TARGET_OBJECTS> generator expression in its "
               "sources list.  This content was not previously part of the "
               "SOURCES property when that property was read at configure "
               "time.  Code reading that property needs to be adapted to "
               "ignore the generator expression using the string(GENEX_STRIP) "
               "command.";
          mf.IssueMessage(messageType, e.str());
        }
        if (addContent) {
          ss << sep;
          sep = ";";
          ss << file;
        }
      } else if (cmGeneratorExpression::Find(file) == std::string::npos) {
        ss << sep;
        sep = ";";
        ss << file;
      } else {
        cmSourceFile* sf = tgt->GetMakefile()->GetOrCreateSource(file);
        // Construct what is known about this source file location.
        cmSourceFileLocation const& location = sf->GetLocation();
        std::string sname = location.GetDirectory();
        if (!sname.empty()) {
          sname += "/";
        }
        sname += location.GetName();

        ss << sep;
        sep = ";";
        // Append this list entry.
        ss << sname;
      }
    }
  }
  static std::string srcs;
  srcs = ss.str();
  return cmValue(srcs);
}